

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O1

int __thiscall KryoFlux::SelectDensity(KryoFlux *this,bool density)

{
  int iVar1;
  undefined7 in_register_00000031;
  string local_30;
  
  (**(code **)(*(long *)this + 0x18))
            (&local_30,this,8,CONCAT71(in_register_00000031,density) & 0xffffffff,0);
  iVar1 = ResponseCode(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int KryoFlux::SelectDensity(bool density)
{
    return ResponseCode(Control(REQ_DENSITY, density));
}